

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::compatible
          (ClauseMatcher *this,ILStruct *bi,MatchInfo *bq,ILStruct *ni,MatchInfo *nq)

{
  LitInfo *pLVar1;
  bool bVar2;
  uint *puVar3;
  MatchInfo *pMVar4;
  MatchInfo *pMVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  MatchInfo *pMVar9;
  MatchInfo *pMVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  
  pLVar1 = (this->lInfos)._array;
  if ((pLVar1[*(uint *)bq].litIndex == pLVar1[*(uint *)nq].litIndex) ||
     ((pLVar1[*(uint *)bq].opposite == true && (pLVar1[*(uint *)nq].opposite != false)))) {
LAB_002bdccb:
    bVar2 = false;
  }
  else {
    uVar12 = bi->varCnt;
    uVar7 = ni->varCnt;
    bVar2 = true;
    if (uVar7 != 0 && uVar12 != 0) {
      pMVar9 = nq + 8;
      puVar3 = ni->sortedGlobalVarNumbers;
      pMVar4 = bq + 8;
      puVar6 = bi->sortedGlobalVarNumbers;
      do {
        while (*puVar6 < *puVar3) {
          puVar6 = puVar6 + 1;
          pMVar4 = pMVar4 + 8;
          uVar12 = uVar12 - 1;
          if (uVar12 == 0) {
            return true;
          }
        }
        do {
          if (*puVar6 <= *puVar3) goto LAB_002bdd54;
          puVar3 = puVar3 + 1;
          pMVar9 = pMVar9 + 8;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        uVar7 = 0;
LAB_002bdd54:
        if (uVar7 != 0) {
          lVar13 = 0;
          pMVar5 = pMVar4;
          pMVar10 = pMVar9;
          do {
            if (*(int *)((long)puVar6 + lVar13) != *(int *)((long)puVar3 + lVar13)) {
              puVar3 = (uint *)((long)puVar3 + lVar13);
              puVar6 = (uint *)((long)puVar6 + lVar13);
              pMVar4 = pMVar5;
              pMVar9 = pMVar10;
              goto LAB_002bddc2;
            }
            if (*(long *)(pMVar4 + lVar13 * 2) != *(long *)(pMVar9 + lVar13 * 2)) goto LAB_002bdccb;
            uVar11 = uVar12 - 1;
            pMVar5 = pMVar5 + 8;
            uVar8 = uVar7 - 1;
            pMVar10 = pMVar10 + 8;
            lVar13 = lVar13 + 4;
          } while ((uVar12 != 1) && (bVar14 = uVar7 != 1, uVar12 = uVar11, uVar7 = uVar8, bVar14));
          puVar3 = (uint *)((long)puVar3 + lVar13);
          puVar6 = (uint *)((long)puVar6 + lVar13);
          pMVar4 = pMVar5;
          pMVar9 = pMVar10;
          uVar12 = uVar11;
          uVar7 = uVar8;
        }
LAB_002bddc2:
      } while ((uVar12 != 0) && (uVar7 != 0));
    }
  }
  return bVar2;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::compatible(ILStruct* bi, MatchInfo* bq, ILStruct* ni, MatchInfo* nq)
{
  if( lInfos[bq->liIndex].litIndex==lInfos[nq->liIndex].litIndex ||
      (lInfos[bq->liIndex].opposite && lInfos[nq->liIndex].opposite) ) {
    return false;
  }

  unsigned bvars=bi->varCnt;
  unsigned* bgvn=bi->sortedGlobalVarNumbers;
  TermList* bb=bq->bindings;

  unsigned nvars=ni->varCnt;
  unsigned* ngvn=ni->sortedGlobalVarNumbers;
  TermList* nb=nq->bindings;

  while(bvars && nvars) {
    while(bvars && *bgvn<*ngvn) {
      bvars--;
      bgvn++;
      bb++;
    }
    if(!bvars) {
      break;
    }
    while(nvars && *bgvn>*ngvn) {
      nvars--;
      ngvn++;
      nb++;
    }
    while(bvars && nvars && *bgvn==*ngvn) {
      if(*bb!=*nb) {
	return false;
      }
      bvars--;
      bgvn++;
      bb++;
      nvars--;
      ngvn++;
      nb++;
    }
  }

  return true;
}